

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

vector<Tle,_std::allocator<Tle>_> *
readTLEs(vector<Tle,_std::allocator<Tle>_> *__return_storage_ptr__,string *fname,FILE *fp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  string line1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string line2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line1._M_dataplus._M_p = (pointer)&line1.field_2;
  line1._M_string_length = 0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line2._M_dataplus._M_p = (pointer)&line2.field_2;
  line2._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  line1.field_2._M_local_buf[0] = '\0';
  line2.field_2._M_local_buf[0] = '\0';
  do {
    local_b0._M_string_length = 0;
    *local_b0._M_dataplus._M_p = '\0';
    bVar1 = readLine(fp,&line1);
    if (!bVar1) {
LAB_00109b06:
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&line2);
      std::__cxx11::string::~string((string *)&line1);
      return __return_storage_ptr__;
    }
    iVar2 = isalpha((int)*line1._M_dataplus._M_p);
    if ((iVar2 != 0) || (line1._M_string_length < 0x19)) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_b0,0x11476d);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (0x16 < local_b0._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = readLine(fp,&line1);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Unexpected error reading TLE line 1 at line ")
      ;
LAB_00109ada:
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," in ");
      poVar4 = std::operator<<(poVar4,(string *)fname);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00109b06;
    }
    bVar1 = readLine(fp,&line2);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Unexpected error reading TLE line 2 at line ")
      ;
      goto LAB_00109ada;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&line1);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&line2);
    std::vector<Tle,std::allocator<Tle>>::
    emplace_back<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string>
              ((vector<Tle,std::allocator<Tle>> *)__return_storage_ptr__,&local_b0,&local_50,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

static std::vector<Tle> readTLEs(const std::string &fname, FILE *fp) {
  std::vector<Tle> tles;
  std::string line1, line2, name;
  size_t lineNo = 0;

  while (readLine(fp, line1)) {
    ++lineNo;
    if (std::isalpha(line1[0]) || line1.size() <= 24)
      name = line1;
    // Trim trailing whitespace from name.
    auto en = name.find_last_not_of(" \t\r\n");
    if (en != std::string::npos)
      name = name.substr(0, en + 1);
    // Celestrak and wikipedia say that names are 24 bytes, libsgp4 says 22.
    if (name.size() > 22)
      name = name.substr(0, 22);
    ++lineNo;
    if (!readLine(fp, line1)) {
      std::cerr << "Unexpected error reading TLE line 1 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }
    ++lineNo;
    if (!readLine(fp, line2)) {
      std::cerr << "Unexpected error reading TLE line 2 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }

    tles.emplace_back(name, line1.substr(0, 69), line2.substr(0, 69));
    name.clear();
  }

  return tles;
}